

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

bool __thiscall ImFontAtlas::Build(ImFontAtlas *this)

{
  float *scanline;
  byte bVar1;
  char cVar2;
  byte bVar3;
  short sVar4;
  ushort uVar5;
  ImFontConfig *pIVar6;
  ImFont *pIVar7;
  ImFontAtlas *pIVar8;
  ushort *puVar9;
  uchar *puVar10;
  long lVar11;
  stbrp_node *psVar12;
  bool bVar13;
  stbtt__edge *psVar14;
  undefined8 uVar15;
  ushort uVar16;
  short sVar17;
  stbtt_uint32 sVar18;
  stbtt_uint32 sVar19;
  stbtt_uint32 sVar20;
  stbtt_uint32 sVar21;
  stbtt_uint32 sVar22;
  stbtt_uint32 sVar23;
  stbtt_uint32 sVar24;
  int iVar25;
  uint uVar26;
  uint uVar27;
  stbtt__active_edge *z;
  ulong uVar28;
  stbrp_context *ptr;
  stbrp_node *ptr_00;
  uchar *puVar29;
  void *pvVar30;
  stbtt__point *points;
  stbtt__edge *p_00;
  float *pfVar31;
  undefined1 auVar32 [8];
  undefined8 *puVar33;
  stbtt__active_edge *psVar34;
  float *pfVar35;
  Glyph *pGVar36;
  Glyph *pGVar37;
  ushort uVar38;
  uint uVar39;
  int iVar40;
  uint uVar41;
  ulong uVar42;
  stbtt__active_edge *psVar43;
  long lVar44;
  int iVar45;
  long lVar46;
  long lVar47;
  ulong uVar48;
  size_t sz;
  ushort uVar49;
  stbtt_fontinfo *psVar50;
  uchar uVar51;
  uint uVar52;
  long lVar53;
  size_t sVar54;
  byte *pbVar55;
  int iVar56;
  int iVar57;
  ulong uVar58;
  int iVar59;
  ImFontConfig *pIVar60;
  void *pvVar61;
  stbtt_uint32 sVar62;
  void *p;
  short *psVar63;
  stbtt__active_edge *psVar64;
  stbtt__edge *psVar65;
  stbtt_uint8 *data;
  byte *pbVar66;
  bool bVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float in_XMM2_Da;
  float fVar75;
  float fVar76;
  float fVar77;
  float in_XMM3_Da;
  float fVar78;
  float fVar79;
  float y0_2;
  int y0;
  int ix0;
  stbtt_pack_context spc;
  int x1;
  ImVector<stbrp_rect> extra_rects;
  int y0_1;
  int x0_1;
  int iy0;
  int x1_1;
  int x0;
  uint local_458;
  undefined8 *local_418;
  undefined1 local_3d0 [8];
  undefined1 local_3c8 [16];
  void *local_3b8;
  void *local_3b0;
  void *local_3a8;
  long local_3a0;
  int local_394;
  long local_390;
  stbtt_fontinfo *local_388;
  float local_37c;
  float local_378;
  uint local_374;
  stbtt_pack_context local_370;
  void *local_338;
  undefined8 local_330;
  ImVector<stbrp_rect> local_328;
  void *local_318;
  void *local_310;
  long local_308;
  stbtt__point *local_300;
  uint local_2f4;
  uint local_2f0;
  float local_2ec;
  float local_2e8;
  uint local_2e4;
  uint local_2e0;
  int local_2dc;
  int local_2d8;
  int local_2d4;
  long local_2d0;
  uchar *local_2c8;
  float *local_2c0;
  float local_2b8;
  undefined4 uStack_2b4;
  undefined4 uStack_2b0;
  undefined4 uStack_2ac;
  long local_2a0;
  long local_298;
  long local_290;
  long local_288;
  long local_280;
  short *local_278;
  long local_270;
  long local_268;
  long local_260;
  size_t local_258;
  size_t local_250;
  ulong local_248;
  int local_240;
  int local_23c;
  undefined8 local_238;
  int local_230;
  
  if ((this->ConfigData).Size < 1) {
    __assert_fail("ConfigData.Size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui_draw.cpp"
                  ,0x4e1,"bool ImFontAtlas::Build()");
  }
  uVar26 = 0;
  this->TexID = (void *)0x0;
  this->TexWidth = 0;
  this->TexHeight = 0;
  (this->TexUvWhitePixel).x = 0.0;
  (this->TexUvWhitePixel).y = 0.0;
  ClearTexData(this);
  local_3b8 = ImGui::MemAlloc((long)(this->ConfigData).Size * 0x50);
  uVar28 = (ulong)(this->ConfigData).Size;
  bVar67 = (long)uVar28 < 1;
  if ((long)uVar28 < 1) {
    iVar45 = 0;
  }
  else {
    pIVar6 = (this->ConfigData).Data;
    uVar58 = 0;
    iVar45 = 0;
    uVar26 = 0;
    do {
      pvVar30 = local_3b8;
      pIVar7 = pIVar6[uVar58].DstFont;
      if ((pIVar7 == (ImFont *)0x0) ||
         (pIVar8 = pIVar7->ContainerAtlas, pIVar8 != this && pIVar8 != (ImFontAtlas *)0x0)) {
        __assert_fail("cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == this)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui_draw.cpp"
                      ,0x4f9,"bool ImFontAtlas::Build()");
      }
      pIVar60 = pIVar6 + uVar58;
      pbVar66 = (byte *)pIVar60->FontData;
      iVar40 = pIVar60->FontNo;
      bVar1 = *pbVar66;
      sVar62 = 0xffffffff;
      if (bVar1 < 0x4f) {
        if (bVar1 == 0) {
          if (((pbVar66[1] == 1) && (pbVar66[2] == 0)) && (pbVar66[3] == 0)) {
LAB_00142b0f:
            sVar62 = -(uint)(iVar40 != 0);
          }
        }
        else if (bVar1 == 0x31) {
          if (((pbVar66[1] != 0) || (pbVar66[2] != 0)) || (pbVar66[3] != 0)) goto LAB_00142a5f;
          goto LAB_00142b0f;
        }
      }
      else {
LAB_00142a5f:
        if (bVar1 == 0x4f) {
          if (((pbVar66[1] == 0x54) && (pbVar66[2] == 0x54)) && (pbVar66[3] == 0x4f))
          goto LAB_00142b0f;
        }
        else if (bVar1 == 0x74) {
          if (((pbVar66[1] == 0x79) && (pbVar66[2] == 0x70)) && (pbVar66[3] == 0x31))
          goto LAB_00142b0f;
          if (((pbVar66[1] == 0x74) && (pbVar66[2] == 99)) && (pbVar66[3] == 0x66)) {
            uVar39 = *(uint *)(pbVar66 + 4);
            uVar39 = uVar39 >> 0x18 | (uVar39 & 0xff0000) >> 8 | (uVar39 & 0xff00) << 8 |
                     uVar39 << 0x18;
            if (((uVar39 == 0x20000) || (uVar39 == 0x10000)) &&
               (uVar39 = *(uint *)(pbVar66 + 8),
               iVar40 < (int)(uVar39 >> 0x18 | (uVar39 & 0xff0000) >> 8 | (uVar39 & 0xff00) << 8 |
                             uVar39 << 0x18))) {
              uVar39 = *(uint *)(pbVar66 + (long)iVar40 * 4 + 0xc);
              sVar62 = uVar39 >> 0x18 | (uVar39 & 0xff0000) >> 8 | (uVar39 & 0xff00) << 8 |
                       uVar39 << 0x18;
            }
          }
        }
      }
      local_3c8._0_8_ = pIVar60;
      if ((int)sVar62 < 0) {
        __assert_fail("font_offset >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui_draw.cpp"
                      ,0x4fb,"bool ImFontAtlas::Build()");
      }
      *(byte **)((long)local_3b8 + uVar58 * 0x50 + 8) = pbVar66;
      *(stbtt_uint32 *)((long)local_3b8 + uVar58 * 0x50 + 0x10) = sVar62;
      sVar18 = stbtt__find_table(pbVar66,sVar62,"cmap");
      sVar19 = stbtt__find_table(pbVar66,sVar62,"loca");
      *(stbtt_uint32 *)((long)pvVar30 + uVar58 * 0x50 + 0x18) = sVar19;
      sVar20 = stbtt__find_table(pbVar66,sVar62,"head");
      *(stbtt_uint32 *)((long)pvVar30 + uVar58 * 0x50 + 0x1c) = sVar20;
      sVar21 = stbtt__find_table(pbVar66,sVar62,"glyf");
      *(stbtt_uint32 *)((long)pvVar30 + uVar58 * 0x50 + 0x20) = sVar21;
      sVar22 = stbtt__find_table(pbVar66,sVar62,"hhea");
      *(stbtt_uint32 *)((long)pvVar30 + uVar58 * 0x50 + 0x24) = sVar22;
      sVar23 = stbtt__find_table(pbVar66,sVar62,"hmtx");
      *(stbtt_uint32 *)((long)pvVar30 + uVar58 * 0x50 + 0x28) = sVar23;
      sVar24 = stbtt__find_table(pbVar66,sVar62,"kern");
      *(stbtt_uint32 *)((long)pvVar30 + uVar58 * 0x50 + 0x2c) = sVar24;
      bVar13 = true;
      if (((((sVar18 != 0) && (sVar19 != 0)) && (sVar20 != 0)) && ((sVar21 != 0 && (sVar22 != 0))))
         && (sVar23 != 0)) {
        sVar62 = stbtt__find_table(pbVar66,sVar62,"maxp");
        if (sVar62 == 0) {
          uVar39 = 0xffff;
        }
        else {
          uVar39 = (uint)(ushort)(*(ushort *)(pbVar66 + (ulong)sVar62 + 4) << 8 |
                                 *(ushort *)(pbVar66 + (ulong)sVar62 + 4) >> 8);
        }
        *(uint *)((long)pvVar30 + uVar58 * 0x50 + 0x14) = uVar39;
        uVar16 = *(ushort *)(pbVar66 + (ulong)sVar18 + 2) << 8 |
                 *(ushort *)(pbVar66 + (ulong)sVar18 + 2) >> 8;
        *(undefined4 *)((long)pvVar30 + uVar58 * 0x50 + 0x30) = 0;
        if (uVar16 != 0) {
          uVar39 = sVar18 + 4;
          uVar42 = (ulong)uVar16;
          do {
            uVar16 = *(ushort *)(pbVar66 + uVar39) << 8 | *(ushort *)(pbVar66 + uVar39) >> 8;
            if ((uVar16 == 0) ||
               ((uVar16 == 3 &&
                ((uVar16 = *(ushort *)(pbVar66 + (ulong)uVar39 + 2) << 8 |
                           *(ushort *)(pbVar66 + (ulong)uVar39 + 2) >> 8, uVar16 == 10 ||
                 (uVar16 == 1)))))) {
              uVar52 = *(uint *)(pbVar66 + (ulong)uVar39 + 4);
              *(uint *)((long)pvVar30 + uVar58 * 0x50 + 0x30) =
                   (uVar52 >> 0x18 | (uVar52 & 0xff0000) >> 8 | (uVar52 & 0xff00) << 8 |
                   uVar52 << 0x18) + sVar18;
            }
            uVar39 = uVar39 + 8;
            uVar42 = uVar42 - 1;
          } while (uVar42 != 0);
        }
        bVar13 = true;
        if (*(int *)((long)pvVar30 + uVar58 * 0x50 + 0x30) != 0) {
          *(uint *)((long)pvVar30 + uVar58 * 0x50 + 0x34) =
               (uint)(ushort)(*(ushort *)(pbVar66 + (long)(int)sVar20 + 0x32) << 8 |
                             *(ushort *)(pbVar66 + (long)(int)sVar20 + 0x32) >> 8);
          bVar13 = false;
        }
      }
      if (!bVar13) {
        if (*(long *)(local_3c8._0_8_ + 0x30) == 0) {
          *(ImWchar **)(local_3c8._0_8_ + 0x30) = GetGlyphRangesDefault::ranges;
        }
        uVar16 = **(ushort **)(local_3c8._0_8_ + 0x30);
        puVar9 = *(ushort **)(local_3c8._0_8_ + 0x30);
        while (uVar16 != 0) {
          if (puVar9[1] == 0) break;
          iVar45 = (iVar45 - (uint)uVar16) + (uint)puVar9[1] + 1;
          uVar26 = uVar26 + 1;
          uVar16 = puVar9[2];
          puVar9 = puVar9 + 2;
        }
      }
      if (bVar13) break;
      uVar58 = uVar58 + 1;
      bVar67 = uVar28 <= uVar58;
    } while (uVar58 != uVar28);
  }
  if (bVar67 != false) {
    uVar39 = this->TexDesiredWidth;
    if ((((int)uVar39 < 1) && (uVar39 = 0x1000, iVar45 < 0xfa1)) && (uVar39 = 0x800, iVar45 < 0x7d1)
       ) {
      uVar39 = (uint)(1000 < iVar45) * 0x200 + 0x200;
    }
    this->TexWidth = uVar39;
    this->TexHeight = 0;
    ptr = (stbrp_context *)ImGui::MemAlloc(0x48);
    ptr_00 = (stbrp_node *)ImGui::MemAlloc((long)(int)uVar39 * 0x10 - 0x10);
    if ((ptr == (stbrp_context *)0x0) || (ptr_00 == (stbrp_node *)0x0)) {
      if (ptr != (stbrp_context *)0x0) {
        ImGui::MemFree(ptr);
      }
      if (ptr_00 != (stbrp_node *)0x0) {
        ImGui::MemFree(ptr_00);
      }
    }
    else {
      local_370.user_allocator_context = (void *)0x0;
      local_370.height = 0x8000;
      local_370.pixels = (uchar *)0x0;
      local_370.padding = 1;
      local_370.h_oversample = 1;
      local_370.v_oversample = 1;
      local_370.pack_info = ptr;
      local_370.width = uVar39;
      local_370.stride_in_bytes = uVar39;
      local_370.nodes = ptr_00;
      if (0x10000 < uVar39) {
        __assert_fail("width <= 0xffff && height <= 0xffff",
                      "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/stb_rect_pack.h"
                      ,0xf2,"void stbrp_init_target(stbrp_context *, int, int, stbrp_node *, int)");
      }
      iVar40 = uVar39 - 1;
      if (uVar39 < 3) {
        uVar28 = 0;
      }
      else {
        uVar28 = 0;
        psVar12 = ptr_00;
        do {
          uVar28 = uVar28 + 1;
          psVar12->next = psVar12 + 1;
          psVar12 = psVar12 + 1;
        } while (uVar39 - 2 != uVar28);
      }
      ptr_00[uVar28].next = (stbrp_node *)0x0;
      ptr->init_mode = 1;
      ptr->heuristic = 0;
      ptr->free_head = ptr_00;
      ptr->active_head = ptr->extra;
      ptr->width = iVar40;
      ptr->height = 0x7fff;
      ptr->num_nodes = iVar40;
      ptr->align = (int)(uVar39 + iVar40 + -2) / iVar40;
      ptr->extra[0].x = 0;
      ptr->extra[0].y = 0;
      ptr->extra[0].next = ptr->extra + 1;
      ptr->extra[1].x = (stbrp_coord)iVar40;
      ptr->extra[1].y = 0xffff;
      ptr->extra[1].next = (stbrp_node *)0x0;
    }
    local_328.Size = 0;
    local_328.Capacity = 0;
    local_328.Data = (stbrp_rect *)0x0;
    RenderCustomTexData(this,0,&local_328);
    local_370.h_oversample = 1;
    local_370.v_oversample = 1;
    if (local_328.Size < 1) {
      __assert_fail("i < Size",
                    "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.h"
                    ,0x35b,"value_type &ImVector<stbrp_rect>::operator[](int) [T = stbrp_rect]");
    }
    stbrp_pack_rects((stbrp_context *)local_370.pack_info,local_328.Data,local_328.Size);
    if (0 < (long)local_328.Size) {
      iVar40 = this->TexHeight;
      lVar53 = 0;
      do {
        if (*(int *)((long)&(local_328.Data)->was_packed + lVar53) != 0) {
          iVar56 = (uint)*(ushort *)((long)&(local_328.Data)->h + lVar53) +
                   (uint)*(ushort *)((long)&(local_328.Data)->y + lVar53);
          if (iVar40 <= iVar56) {
            iVar40 = iVar56;
          }
          this->TexHeight = iVar40;
        }
        lVar53 = lVar53 + 0x10;
      } while ((long)local_328.Size * 0x10 != lVar53);
    }
    sVar54 = (long)iVar45 * 0x1c;
    local_338 = ImGui::MemAlloc(sVar54);
    sz = (long)iVar45 << 4;
    local_310 = ImGui::MemAlloc(sz);
    local_318 = ImGui::MemAlloc((long)(int)uVar26 * 0x28);
    pvVar30 = local_338;
    memset(local_338,0,sVar54);
    memset(local_310,0,sz);
    memset(local_318,0,(long)(int)uVar26 * 0x28);
    local_458 = 0;
    iVar40 = 0;
    iVar56 = 0;
    if (0 < (this->ConfigData).Size) {
      pvVar61 = (void *)0x0;
      iVar56 = 0;
      iVar40 = 0;
      local_458 = 0;
      do {
        pIVar6 = (this->ConfigData).Data;
        puVar9 = pIVar6[(long)pvVar61].GlyphRanges;
        uVar16 = *puVar9;
        uVar28 = 0;
        local_3b0 = (void *)0x0;
        if (uVar16 != 0) {
          uVar28 = 0;
          local_3b0 = (void *)0x0;
          do {
            if (puVar9[uVar28 * 2 + 1] == 0) break;
            local_3b0 = (void *)(ulong)(((int)local_3b0 - (uint)uVar16) +
                                        (uint)puVar9[uVar28 * 2 + 1] + 1);
            uVar16 = puVar9[uVar28 * 2 + 2];
            uVar28 = uVar28 + 1;
          } while (uVar16 != 0);
        }
        psVar50 = (stbtt_fontinfo *)((long)pvVar61 * 0x50 + (long)local_3b8);
        pfVar31 = (float *)((long)local_318 + (ulong)local_458 * 0x28);
        psVar50[1].data = (uchar *)pfVar31;
        iVar57 = (int)uVar28;
        psVar50[1].fontstart = iVar57;
        if (iVar57 != 0) {
          fVar68 = pIVar6[(long)pvVar61].SizePixels;
          uVar58 = 0;
          do {
            *pfVar31 = fVar68;
            uVar16 = puVar9[uVar58 * 2];
            pfVar31[1] = (float)(uint)uVar16;
            iVar59 = (uint)puVar9[uVar58 * 2 + 1] - (uint)uVar16;
            pfVar31[4] = (float)(iVar59 + 1);
            *(void **)(pfVar31 + 6) = (void *)((long)iVar56 * 0x1c + (long)pvVar30);
            iVar56 = iVar59 + iVar56 + 1;
            uVar58 = uVar58 + 1;
            pfVar31 = pfVar31 + 10;
          } while ((uVar28 & 0xffffffff) != uVar58);
        }
        psVar50[1].userdata = (void *)((long)iVar40 * 0x10 + (long)local_310);
        local_3a8 = pvVar61;
        stbtt_PackSetOversampling
                  (&local_370,pIVar6[(long)pvVar61].OversampleH,pIVar6[(long)pvVar61].OversampleV);
        uVar15 = local_370._32_8_;
        iVar59 = psVar50[1].fontstart;
        if ((long)iVar59 < 1) {
          uVar39 = 0;
        }
        else {
          puVar29 = psVar50[1].data;
          uVar58 = local_370._32_8_ & 0xffffffff;
          uVar28 = (ulong)local_370._32_8_ >> 0x20;
          sVar4 = (short)local_370.v_oversample;
          sVar17 = (short)local_370.padding;
          local_3a0 = (long)psVar50[1].userdata + 6;
          lVar53 = 0;
          uVar39 = 0;
          do {
            fVar68 = *(float *)(puVar29 + lVar53 * 0x28);
            if (fVar68 <= 0.0) {
              fVar68 = -fVar68;
              uVar52 = (uint)(ushort)(*(ushort *)(psVar50->data + (long)psVar50->head + 0x12) << 8 |
                                     *(ushort *)(psVar50->data + (long)psVar50->head + 0x12) >> 8);
            }
            else {
              puVar10 = psVar50->data;
              lVar46 = (long)psVar50->hhea;
              uVar52 = ((int)(short)((ushort)puVar10[lVar46 + 4] << 8) | (uint)puVar10[lVar46 + 5])
                       - ((int)(short)((ushort)puVar10[lVar46 + 6] << 8) | (uint)puVar10[lVar46 + 7]
                         );
            }
            puVar29[lVar53 * 0x28 + 0x20] = (uchar)uVar58;
            puVar29[lVar53 * 0x28 + 0x21] = SUB81(uVar15,4);
            if (0 < *(int *)(puVar29 + lVar53 * 0x28 + 0x10)) {
              local_3c8._0_4_ = uVar39;
              psVar63 = (short *)((long)(int)uVar39 * 0x10 + local_3a0);
              lVar46 = 0;
              do {
                if (*(long *)(puVar29 + lVar53 * 0x28 + 8) == 0) {
                  iVar25 = *(int *)(puVar29 + lVar53 * 0x28 + 4) + (int)lVar46;
                }
                else {
                  iVar25 = *(int *)(*(long *)(puVar29 + lVar53 * 0x28 + 8) + lVar46 * 4);
                }
                iVar25 = stbtt_FindGlyphIndex(psVar50,iVar25);
                stbtt_GetGlyphBitmapBoxSubpixel
                          (psVar50,iVar25,(fVar68 / (float)(int)uVar52) * (float)uVar58,
                           (fVar68 / (float)(int)uVar52) * (float)uVar28,in_XMM2_Da,in_XMM3_Da,
                           (int *)&local_238,(int *)local_3d0,(int *)&local_330,&local_394);
                psVar63[-1] = (((short)(int)local_330 + (short)uVar15) - (short)local_238) + sVar17
                              + -1;
                *psVar63 = ~local_3d0._0_2_ + (short)local_394 + sVar4 + sVar17;
                lVar46 = lVar46 + 1;
                psVar63 = psVar63 + 8;
              } while (lVar46 < *(int *)(puVar29 + lVar53 * 0x28 + 0x10));
              uVar39 = local_3c8._0_4_ + (int)lVar46;
            }
            lVar53 = lVar53 + 1;
          } while (lVar53 != iVar59);
        }
        stbrp_pack_rects((stbrp_context *)local_370.pack_info,(stbrp_rect *)psVar50[1].userdata,
                         uVar39);
        if (0 < (int)uVar39) {
          iVar59 = this->TexHeight;
          pvVar30 = psVar50[1].userdata;
          lVar53 = 0;
          do {
            if (*(int *)((long)pvVar30 + lVar53 + 0xc) != 0) {
              iVar25 = (uint)*(ushort *)((long)pvVar30 + lVar53 + 6) +
                       (uint)*(ushort *)((long)pvVar30 + lVar53 + 10);
              if (iVar59 <= iVar25) {
                iVar59 = iVar25;
              }
              this->TexHeight = iVar59;
            }
            lVar53 = lVar53 + 0x10;
          } while ((ulong)uVar39 << 4 != lVar53);
        }
        local_458 = iVar57 + local_458;
        iVar40 = (int)local_3b0 + iVar40;
        pvVar61 = (void *)((long)local_3a8 + 1);
        pvVar30 = local_338;
      } while ((long)pvVar61 < (long)(this->ConfigData).Size);
    }
    if (iVar40 != iVar45) {
      __assert_fail("buf_rects_n == total_glyph_count",
                    "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui_draw.cpp"
                    ,0x54b,"bool ImFontAtlas::Build()");
    }
    if (iVar56 != iVar45) {
      __assert_fail("buf_packedchars_n == total_glyph_count",
                    "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui_draw.cpp"
                    ,0x54c,"bool ImFontAtlas::Build()");
    }
    if (local_458 != uVar26) {
      __assert_fail("buf_ranges_n == total_glyph_range_count",
                    "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui_draw.cpp"
                    ,0x54d,"bool ImFontAtlas::Build()");
    }
    uVar26 = this->TexHeight - 1;
    uVar26 = (int)uVar26 >> 1 | uVar26;
    uVar26 = (int)uVar26 >> 2 | uVar26;
    uVar26 = (int)uVar26 >> 4 | uVar26;
    uVar26 = (int)uVar26 >> 8 | uVar26;
    lVar53 = (long)(int)((int)uVar26 >> 0x10 | uVar26) + 1;
    this->TexHeight = (int)lVar53;
    puVar29 = (uchar *)ImGui::MemAlloc(this->TexWidth * lVar53);
    this->TexPixelsAlpha8 = puVar29;
    memset(puVar29,0,(long)this->TexHeight * (long)this->TexWidth);
    local_370.pixels = this->TexPixelsAlpha8;
    local_370.height = this->TexHeight;
    if (0 < (this->ConfigData).Size) {
      lVar53 = 0;
      do {
        pvVar30 = local_3b8;
        pIVar6 = (this->ConfigData).Data;
        lVar46 = lVar53 * 0x50;
        local_388 = (stbtt_fontinfo *)((long)local_3b8 + lVar46);
        local_2a0 = lVar53;
        stbtt_PackSetOversampling(&local_370,pIVar6[lVar53].OversampleH,pIVar6[lVar53].OversampleV);
        local_298 = (long)*(int *)((long)pvVar30 + lVar46 + 0x48);
        local_2f0 = local_370.h_oversample;
        local_2f4 = local_370.v_oversample;
        if (0 < local_298) {
          lVar53 = *(long *)((long)local_3b8 + lVar46 + 0x38);
          local_2d0 = *(long *)((long)local_3b8 + lVar46 + 0x40);
          lVar44 = 0;
          lVar46 = 0;
          local_288 = lVar53;
          do {
            local_2b8 = *(float *)(local_2d0 + lVar44 * 0x28);
            if (local_2b8 <= 0.0) {
              uStack_2b4 = 0x80000000;
              uStack_2b0 = 0x80000000;
              uStack_2ac = 0x80000000;
              local_2b8 = -local_2b8;
              uVar26 = (uint)(ushort)(*(ushort *)(local_388->data + (long)local_388->head + 0x12) <<
                                      8 | *(ushort *)
                                           (local_388->data + (long)local_388->head + 0x12) >> 8);
            }
            else {
              puVar29 = local_388->data;
              lVar47 = (long)local_388->hhea;
              uVar26 = ((int)(short)((ushort)puVar29[lVar47 + 4] << 8) | (uint)puVar29[lVar47 + 5])
                       - ((int)(short)((ushort)puVar29[lVar47 + 6] << 8) | (uint)puVar29[lVar47 + 7]
                         );
              uStack_2b4 = 0;
              uStack_2b0 = 0;
              uStack_2ac = 0;
            }
            local_2b8 = local_2b8 / (float)(int)uVar26;
            lVar47 = local_2d0 + lVar44 * 0x28;
            bVar1 = *(byte *)(lVar47 + 0x20);
            fVar68 = (float)bVar1;
            local_378 = 0.0;
            local_37c = 0.0;
            if (bVar1 != 0) {
              local_37c = (float)(int)(1 - (uint)bVar1) / (fVar68 + fVar68);
            }
            local_370.v_oversample._0_1_ = *(byte *)(lVar47 + 0x21);
            local_370.h_oversample = (uint)bVar1;
            local_370.v_oversample._1_3_ = 0;
            fVar71 = (float)(byte)local_370.v_oversample;
            if ((byte)local_370.v_oversample != 0) {
              local_378 = (float)(int)(1 - (uint)(byte)local_370.v_oversample) / (fVar71 + fVar71);
            }
            local_290 = lVar44;
            if (0 < *(int *)(lVar47 + 0x10)) {
              fVar68 = 1.0 / fVar68;
              local_2ec = 1.0 / fVar71;
              lVar46 = (long)(int)lVar46;
              lVar44 = 0;
              local_2e8 = fVar68;
              local_280 = lVar47;
              do {
                psVar50 = local_388;
                if (*(int *)(lVar53 + 0xc + lVar46 * 0x10) != 0) {
                  if (*(long *)(lVar47 + 8) == 0) {
                    iVar45 = *(int *)(lVar47 + 4) + (int)lVar44;
                  }
                  else {
                    iVar45 = *(int *)(*(long *)(lVar47 + 8) + lVar44 * 4);
                  }
                  lVar53 = lVar46 * 0x10 + lVar53;
                  local_278 = (short *)(lVar44 * 0x1c + *(long *)(lVar47 + 0x18));
                  local_270 = lVar44;
                  local_268 = lVar46;
                  iVar40 = stbtt_FindGlyphIndex(local_388,iVar45);
                  uVar49 = *(short *)(lVar53 + 8) + (short)local_370.padding;
                  *(ushort *)(lVar53 + 8) = uVar49;
                  uVar16 = *(short *)(lVar53 + 10) + (short)local_370.padding;
                  *(ushort *)(lVar53 + 10) = uVar16;
                  uVar26 = *(int *)(lVar53 + 4) - local_370.padding;
                  *(short *)(lVar53 + 4) = (short)uVar26;
                  uVar39 = (uint)*(ushort *)(lVar53 + 6) - local_370.padding;
                  *(short *)(lVar53 + 6) = (short)uVar39;
                  puVar29 = psVar50->data;
                  uVar38 = *(ushort *)(puVar29 + (long)psVar50->hhea + 0x22) << 8 |
                           *(ushort *)(puVar29 + (long)psVar50->hhea + 0x22) >> 8;
                  iVar45 = psVar50->hmtx;
                  lVar46 = (ulong)uVar38 * 4 + (long)iVar45 + -4;
                  lVar44 = (ulong)uVar38 * 4 + (long)iVar45 + -3;
                  if (iVar40 < (int)(uint)uVar38) {
                    lVar46 = (long)(iVar40 * 4) + (long)iVar45;
                    lVar44 = (long)(iVar40 * 4) + 1 + (long)iVar45;
                  }
                  local_2e0 = (uint)puVar29[lVar46];
                  local_2e4 = (uint)puVar29[lVar44];
                  uVar52 = local_370.h_oversample;
                  uVar41 = local_370.v_oversample;
                  fVar69 = (float)(local_370._32_8_ & 0xffffffff) * local_2b8;
                  fVar72 = (float)local_370.v_oversample * local_2b8;
                  fVar71 = local_2b8;
                  local_308 = lVar53;
                  stbtt_GetGlyphBitmapBoxSubpixel
                            (psVar50,iVar40,fVar69,fVar72,local_2b8,fVar68,&local_2d8,&local_2dc,
                             &local_23c,&local_240);
                  local_2c8 = local_370.pixels + uVar49;
                  local_374 = local_370.stride_in_bytes;
                  uVar27 = stbtt_GetGlyphShape(psVar50,iVar40,(stbtt_vertex **)&local_330);
                  uVar52 = (uVar26 & 0xffff) - uVar52;
                  pvVar30 = (void *)(ulong)uVar52;
                  uVar52 = uVar52 + 1;
                  local_3a8 = pvVar30;
                  stbtt_GetGlyphBitmapBoxSubpixel
                            (local_388,iVar40,fVar69,fVar72,fVar71,fVar68,&local_394,&local_2d4,
                             (int *)0x0,(int *)0x0);
                  if (uVar52 != 0) {
                    uVar41 = (uVar39 & 0xffff) - uVar41;
                    if (uVar41 + 1 != 0) {
                      lVar53 = CONCAT44(local_330._4_4_,(int)local_330);
                      local_3a0 = CONCAT44(local_3a0._4_4_,local_394);
                      local_390 = CONCAT44(local_390._4_4_,local_2d4);
                      local_238 = local_238 & 0xffffffff00000000;
                      if ((int)uVar27 < 1) {
                        uVar26 = 0;
                      }
                      else {
                        lVar46 = 0;
                        uVar26 = 0;
                        do {
                          uVar26 = uVar26 + (*(char *)(lVar53 + 8 + lVar46) == '\x01');
                          lVar46 = lVar46 + 10;
                        } while ((ulong)uVar27 * 10 != lVar46);
                      }
                      if (uVar26 == 0) {
LAB_00143baa:
                        points = (stbtt__point *)0x0;
                      }
                      else {
                        pvVar30 = ImGui::MemAlloc((long)(int)uVar26 << 2);
                        if (pvVar30 == (void *)0x0) {
                          uVar26 = 0;
                          goto LAB_00143baa;
                        }
                        fVar68 = fVar72;
                        if (fVar69 <= fVar72) {
                          fVar68 = fVar69;
                        }
                        uVar28 = 0;
                        fVar71 = 0.0;
                        points = (stbtt__point *)0x0;
                        do {
                          if ((int)uVar28 == 0) {
LAB_001439e6:
                            local_238 = local_238 & 0xffffffff00000000;
                            if ((int)uVar27 < 1) {
                              lVar46 = -1;
                            }
                            else {
                              local_3c8._0_8_ = uVar28;
                              uVar39 = 0xffffffff;
                              fVar73 = 0.0;
                              lVar46 = 0;
                              fVar70 = 0.0;
                              do {
                                cVar2 = *(char *)(lVar53 + 8 + lVar46);
                                if (cVar2 == '\x03') {
                                  stbtt__tesselate_curve
                                            (points,(int *)&local_238,fVar70,fVar73,
                                             (float)(int)*(short *)(lVar53 + 4 + lVar46),
                                             (float)(int)*(short *)(lVar53 + 6 + lVar46),
                                             (float)(int)*(short *)(lVar53 + lVar46),
                                             (float)(int)*(short *)(lVar53 + 2 + lVar46),
                                             (0.35 / fVar68) * (0.35 / fVar68),0);
                                  fVar70 = (float)(int)*(short *)(lVar53 + lVar46);
                                  fVar73 = (float)(int)*(short *)(lVar53 + 2 + lVar46);
                                  uVar28 = local_238;
                                }
                                else {
                                  if (cVar2 == '\x02') {
                                    sVar4 = *(short *)(lVar53 + lVar46);
                                    sVar17 = *(short *)(lVar53 + 2 + lVar46);
                                  }
                                  else {
                                    uVar28 = local_238;
                                    if (cVar2 != '\x01') goto LAB_00143b2e;
                                    if (-1 < (int)uVar39) {
                                      *(int *)((long)pvVar30 + (ulong)uVar39 * 4) =
                                           (int)(float)local_238 - (int)fVar71;
                                    }
                                    uVar39 = uVar39 + 1;
                                    sVar4 = *(short *)(lVar53 + lVar46);
                                    sVar17 = *(short *)(lVar53 + 2 + lVar46);
                                    fVar71 = (float)local_238;
                                  }
                                  uVar28 = CONCAT44(local_238._4_4_,(int)(float)local_238 + 1);
                                  fVar73 = (float)(int)sVar17;
                                  fVar70 = (float)(int)sVar4;
                                  if (points != (stbtt__point *)0x0) {
                                    points[(int)(float)local_238].x = fVar70;
                                    points[(int)(float)local_238].y = fVar73;
                                  }
                                }
LAB_00143b2e:
                                local_238 = uVar28;
                                lVar46 = lVar46 + 10;
                              } while ((ulong)uVar27 * 10 != lVar46);
                              lVar46 = (long)(int)uVar39;
                              uVar28 = local_3c8._0_8_;
                            }
                            *(int *)((long)pvVar30 + lVar46 * 4) =
                                 (int)(float)local_238 - (int)fVar71;
                            bVar13 = true;
                          }
                          else {
                            points = (stbtt__point *)
                                     ImGui::MemAlloc((long)(int)(float)local_238 << 3);
                            if (points != (stbtt__point *)0x0) goto LAB_001439e6;
                            points = (stbtt__point *)0x0;
                            bVar13 = false;
                          }
                          if (!bVar13) {
                            ImGui::MemFree(points);
                            ImGui::MemFree(pvVar30);
                            uVar26 = 0;
                            pvVar30 = (void *)0x0;
                            goto LAB_00143baa;
                          }
                          iVar45 = (int)uVar28;
                          uVar28 = (ulong)(iVar45 + 1);
                        } while (iVar45 == 0);
                      }
                      local_300 = points;
                      if (points != (stbtt__point *)0x0) {
                        if ((int)uVar26 < 1) {
                          sVar54 = 0x14;
                        }
                        else {
                          uVar28 = 0;
                          lVar53 = 0;
                          do {
                            lVar53 = (long)(int)lVar53 + (long)*(int *)((long)pvVar30 + uVar28 * 4);
                            uVar28 = uVar28 + 1;
                          } while (uVar26 != uVar28);
                          sVar54 = lVar53 * 0x14 + 0x14;
                        }
                        p_00 = (stbtt__edge *)ImGui::MemAlloc(sVar54);
                        if (p_00 != (stbtt__edge *)0x0) {
                          if ((int)uVar26 < 1) {
                            uVar39 = 0;
                          }
                          else {
                            uVar28 = 0;
                            uVar39 = 0;
                            iVar45 = 0;
                            do {
                              iVar40 = *(int *)((long)pvVar30 + uVar28 * 4);
                              if (0 < iVar40) {
                                uVar42 = (ulong)(iVar40 - 1);
                                uVar58 = 0;
                                do {
                                  iVar56 = (int)uVar42;
                                  fVar68 = local_300[(long)iVar45 + (long)iVar56].y;
                                  fVar71 = local_300[(long)iVar45 + uVar58].y;
                                  if ((fVar68 != fVar71) || (NAN(fVar68) || NAN(fVar71))) {
                                    iVar59 = (int)uVar58;
                                    iVar57 = iVar56;
                                    if (fVar68 <= fVar71) {
                                      iVar57 = iVar59;
                                      iVar59 = iVar56;
                                    }
                                    p_00[(int)uVar39].invert = (uint)(fVar71 < fVar68);
                                    p_00[(int)uVar39].x0 =
                                         local_300[(long)iVar45 + (long)iVar57].x * fVar69 + 0.0;
                                    p_00[(int)uVar39].y0 =
                                         local_300[(long)iVar45 + (long)iVar57].y * -fVar72 + 0.0;
                                    p_00[(int)uVar39].x1 =
                                         local_300[(long)iVar45 + (long)iVar59].x * fVar69 + 0.0;
                                    p_00[(int)uVar39].y1 =
                                         local_300[(long)iVar45 + (long)iVar59].y * -fVar72 + 0.0;
                                    uVar39 = uVar39 + 1;
                                  }
                                  uVar42 = uVar58 & 0xffffffff;
                                  uVar58 = uVar58 + 1;
                                } while ((long)uVar58 < (long)*(int *)((long)pvVar30 + uVar28 * 4));
                              }
                              iVar45 = iVar45 + iVar40;
                              uVar28 = uVar28 + 1;
                            } while (uVar28 != uVar26);
                          }
                          stbtt__sort_edges_quicksort(p_00,uVar39);
                          if (1 < (int)uVar39) {
                            uVar28 = 1;
                            do {
                              fVar68 = p_00[uVar28].x0;
                              fVar71 = p_00[uVar28].y0;
                              local_230 = p_00[uVar28].invert;
                              local_238._0_4_ = p_00[uVar28].x1;
                              local_238._4_4_ = p_00[uVar28].y1;
                              uVar58 = uVar28 & 0xffffffff;
                              do {
                                uVar26 = (uint)uVar58;
                                if ((int)uVar26 < 1) break;
                                fVar69 = p_00[uVar58 - 1].y0;
                                if (fVar71 < fVar69) {
                                  psVar65 = p_00 + uVar58;
                                  psVar65->invert = psVar65[-1].invert;
                                  fVar72 = psVar65[-1].y0;
                                  fVar70 = psVar65[-1].x1;
                                  fVar73 = psVar65[-1].y1;
                                  psVar65->x0 = psVar65[-1].x0;
                                  psVar65->y0 = fVar72;
                                  psVar65->x1 = fVar70;
                                  psVar65->y1 = fVar73;
                                  uVar58 = (ulong)(uVar26 - 1);
                                }
                                uVar26 = (uint)uVar58;
                              } while (fVar71 < fVar69);
                              if (uVar28 != uVar26) {
                                p_00[(int)uVar26].x0 = fVar68;
                                p_00[(int)uVar26].y0 = fVar71;
                                p_00[(int)uVar26].x1 = (float)local_238;
                                p_00[(int)uVar26].y1 = (float)local_238._4_4_;
                                p_00[(int)uVar26].invert = local_230;
                              }
                              uVar28 = uVar28 + 1;
                            } while (uVar28 != uVar39);
                          }
                          local_3d0 = (undefined1  [8])0x0;
                          pfVar31 = (float *)&local_238;
                          if (0x40 < (int)uVar52) {
                            pfVar31 = (float *)ImGui::MemAlloc((ulong)uVar52 * 8 + 4);
                          }
                          p_00[(int)uVar39].y0 = (float)(int)(uVar41 + 1 + (int)local_390) + 1.0;
                          if (uVar41 < 0x7fffffff) {
                            local_2c8 = local_2c8 + (int)(uVar16 * local_374);
                            fVar68 = (float)(int)(float)local_3a0;
                            local_260 = (long)(int)uVar52;
                            scanline = pfVar31 + local_260;
                            local_2c0 = scanline + 1;
                            local_250 = local_260 * 4;
                            fVar71 = (float)(int)uVar52;
                            local_258 = (long)((int)local_3a8 + 2) << 2;
                            local_3b0 = (void *)0x0;
                            uVar28 = 0;
                            local_418 = (undefined8 *)0x0;
                            local_458 = 0;
                            psVar64 = (stbtt__active_edge *)0x0;
                            psVar65 = p_00;
                            iVar45 = (int)local_390;
                            do {
                              local_390 = CONCAT44(local_390._4_4_,iVar45);
                              fVar69 = (float)iVar45;
                              fVar72 = fVar69 + 1.0;
                              local_248 = uVar28;
                              memset(pfVar31,0,local_250);
                              memset(scanline,0,local_258);
                              if (local_3d0 != (undefined1  [8])0x0) {
                                auVar32 = local_3d0;
                                psVar34 = (stbtt__active_edge *)local_3d0;
                                do {
                                  psVar43 = (stbtt__active_edge *)auVar32;
                                  if (((stbtt__active_edge *)auVar32)->ey <= fVar69) {
                                    psVar34->next = ((stbtt__active_edge *)auVar32)->next;
                                    if ((((stbtt__active_edge *)auVar32)->direction == 0.0) &&
                                       (!NAN(((stbtt__active_edge *)auVar32)->direction))) {
                                      __assert_fail("z->direction",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/stb_truetype.h"
                                                  ,0x83b,
                                                  "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                                                  );
                                    }
                                    ((stbtt__active_edge *)auVar32)->direction = 0.0;
                                    ((stbtt__active_edge *)auVar32)->next = psVar64;
                                    psVar43 = psVar34;
                                    psVar64 = (stbtt__active_edge *)auVar32;
                                  }
                                  auVar32 = (undefined1  [8])psVar43->next;
                                  psVar34 = psVar43;
                                } while (auVar32 != (undefined1  [8])0x0);
                              }
                              fVar70 = psVar65->y0;
                              while (auVar32 = local_3d0, fVar70 <= fVar72) {
                                psVar34 = psVar64;
                                if ((fVar70 != psVar65->y1) || (NAN(fVar70) || NAN(psVar65->y1))) {
                                  if (psVar64 == (stbtt__active_edge *)0x0) {
                                    if (local_458 == 0) {
                                      puVar33 = (undefined8 *)ImGui::MemAlloc(0x6408);
                                      if (puVar33 == (undefined8 *)0x0) {
                                        psVar64 = (stbtt__active_edge *)0x0;
                                        goto LAB_00144046;
                                      }
                                      *puVar33 = local_418;
                                      local_458 = 800;
                                      local_418 = puVar33;
                                    }
                                    lVar53 = (long)(int)local_458;
                                    local_458 = local_458 + -1;
                                    psVar64 = (stbtt__active_edge *)(local_418 + lVar53 * 4 + -4);
                                  }
                                  else {
                                    psVar34 = psVar64->next;
                                  }
LAB_00144046:
                                  if (psVar64 == (stbtt__active_edge *)0x0) {
                                    __assert_fail("z != __null",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/stb_truetype.h"
                                                  ,0x6ab,
                                                  "stbtt__active_edge *stbtt__new_active(stbtt__hheap *, stbtt__edge *, int, float, void *)"
                                                 );
                                  }
                                  fVar70 = psVar65->x0;
                                  fVar73 = psVar65->y0;
                                  fVar77 = psVar65->y1;
                                  fVar75 = (psVar65->x1 - fVar70) / (fVar77 - fVar73);
                                  psVar64->fdx = fVar75;
                                  psVar64->fdy = (float)(-(uint)(fVar75 != 0.0) &
                                                        (uint)(1.0 / fVar75));
                                  psVar64->fx = ((fVar69 - fVar73) * fVar75 + fVar70) - fVar68;
                                  psVar64->direction =
                                       *(float *)(&DAT_0016794c + (ulong)(psVar65->invert == 0) * 4)
                                  ;
                                  psVar64->sy = fVar73;
                                  psVar64->ey = fVar77;
                                  psVar64->next = (stbtt__active_edge *)0x0;
                                  if (fVar77 < fVar69) {
                                    __assert_fail("z->ey >= scan_y_top",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/stb_truetype.h"
                                                  ,0x848,
                                                  "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                                                 );
                                  }
                                  psVar64->next = (stbtt__active_edge *)local_3d0;
                                  local_3d0 = (undefined1  [8])psVar64;
                                }
                                psVar14 = psVar65 + 1;
                                psVar65 = psVar65 + 1;
                                psVar64 = psVar34;
                                fVar70 = psVar14->y0;
                              }
                              for (; auVar32 != (undefined1  [8])0x0;
                                  auVar32 = (undefined1  [8])((stbtt__active_edge *)auVar32)->next)
                              {
                                fVar70 = ((stbtt__active_edge *)auVar32)->ey;
                                if (fVar70 < fVar69) {
                                  __assert_fail("e->ey >= y_top",
                                                "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/stb_truetype.h"
                                                ,0x77f,
                                                "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                               );
                                }
                                fVar73 = ((stbtt__active_edge *)auVar32)->fx;
                                fVar77 = ((stbtt__active_edge *)auVar32)->fdx;
                                if ((fVar77 != 0.0) || (NAN(fVar77))) {
                                  fVar75 = ((stbtt__active_edge *)auVar32)->sy;
                                  if (fVar72 < fVar75) {
                                    __assert_fail("e->sy <= y_bottom && e->ey >= y_top",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/stb_truetype.h"
                                                  ,0x792,
                                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                                 );
                                  }
                                  fVar79 = fVar77 + fVar73;
                                  fVar76 = (float)(~-(uint)(fVar69 < fVar75) & (uint)fVar73 |
                                                  (uint)((fVar75 - fVar69) * fVar77 + fVar73) &
                                                  -(uint)(fVar69 < fVar75));
                                  if ((((fVar76 < 0.0) ||
                                       (fVar78 = (float)(~-(uint)(fVar70 < fVar72) & (uint)fVar79 |
                                                        (uint)((fVar70 - fVar69) * fVar77 + fVar73)
                                                        & -(uint)(fVar70 < fVar72)), fVar78 < 0.0))
                                      || (fVar71 <= fVar76)) || (fVar71 <= fVar78)) {
                                    if ((uint)local_3a8._0_4_ < 0x7fffffff) {
                                      local_3c8 = ZEXT416((uint)fVar79);
                                      local_3a0 = CONCAT44(local_3a0._4_4_,fVar77);
                                      uVar26 = 0;
                                      do {
                                        fVar70 = (float)(int)uVar26;
                                        uVar39 = uVar26 + 1;
                                        fVar76 = (float)(int)uVar39;
                                        fVar75 = (fVar70 - fVar73) / fVar77 + fVar69;
                                        fVar77 = (fVar76 - fVar73) / fVar77 + fVar69;
                                        if ((fVar70 <= fVar73) || (fVar79 <= fVar76)) {
                                          if ((fVar79 < fVar70) && (fVar76 < fVar73)) {
                                            stbtt__handle_clipped_edge
                                                      (pfVar31,uVar26,(stbtt__active_edge *)auVar32,
                                                       fVar73,fVar69,fVar76,fVar77);
                                            fVar78 = fVar76;
                                            fVar74 = fVar77;
LAB_001443f9:
                                            stbtt__handle_clipped_edge
                                                      (pfVar31,uVar26,(stbtt__active_edge *)auVar32,
                                                       fVar78,fVar74,fVar70,fVar75);
                                            goto LAB_00144413;
                                          }
                                          fVar78 = fVar73;
                                          fVar74 = fVar69;
                                          if (((fVar73 < fVar70) && (fVar70 < fVar79)) ||
                                             ((fVar79 < fVar70 && (fVar70 < fVar73))))
                                          goto LAB_001443f9;
                                          fVar70 = fVar73;
                                          fVar75 = fVar69;
                                          if (((fVar73 < fVar76) && (fVar76 < fVar79)) ||
                                             ((fVar79 < fVar76 && (fVar76 < fVar73))))
                                          goto LAB_00144367;
                                        }
                                        else {
                                          stbtt__handle_clipped_edge
                                                    (pfVar31,uVar26,(stbtt__active_edge *)auVar32,
                                                     fVar73,fVar69,fVar70,fVar75);
LAB_00144367:
                                          stbtt__handle_clipped_edge
                                                    (pfVar31,uVar26,(stbtt__active_edge *)auVar32,
                                                     fVar70,fVar75,fVar76,fVar77);
                                          fVar70 = fVar76;
                                          fVar75 = fVar77;
LAB_00144413:
                                          fVar79 = (float)local_3c8._0_4_;
                                        }
                                        stbtt__handle_clipped_edge
                                                  (pfVar31,uVar26,(stbtt__active_edge *)auVar32,
                                                   fVar70,fVar75,fVar79,fVar72);
                                        fVar77 = (float)local_3a0;
                                        fVar79 = (float)local_3c8._0_4_;
                                        uVar26 = uVar39;
                                      } while (uVar52 != uVar39);
                                    }
                                  }
                                  else {
                                    if (fVar75 <= fVar69) {
                                      fVar75 = fVar69;
                                    }
                                    uVar26 = (uint)fVar76;
                                    if (fVar72 <= fVar70) {
                                      fVar70 = fVar72;
                                    }
                                    if (uVar26 == (int)fVar78) {
                                      if (((int)uVar26 < 0) || ((int)uVar52 <= (int)uVar26)) {
                                        __assert_fail("x >= 0 && x < len",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/stb_truetype.h"
                                                  ,0x7ae,
                                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                                  );
                                      }
                                      uVar28 = (ulong)uVar26;
                                      pfVar31[uVar28] =
                                           (((fVar78 - (float)(int)uVar26) +
                                            (fVar76 - (float)(int)uVar26)) * -0.5 + 1.0) *
                                           ((stbtt__active_edge *)auVar32)->direction *
                                           (fVar70 - fVar75) + pfVar31[uVar28];
                                      fVar73 = (fVar70 - fVar75) *
                                               ((stbtt__active_edge *)auVar32)->direction;
                                    }
                                    else {
                                      fVar77 = ((stbtt__active_edge *)auVar32)->fdy;
                                      fVar74 = fVar78;
                                      if (fVar78 < fVar76) {
                                        fVar73 = fVar69 - fVar75;
                                        fVar75 = (fVar69 - fVar70) + fVar72;
                                        fVar77 = -fVar77;
                                        fVar70 = fVar73 + fVar72;
                                        fVar74 = fVar76;
                                        fVar73 = fVar79;
                                        fVar76 = fVar78;
                                      }
                                      iVar40 = (int)fVar74;
                                      iVar45 = (int)fVar76 + 1;
                                      fVar78 = ((float)iVar45 - fVar73) * fVar77 + fVar69;
                                      fVar73 = ((stbtt__active_edge *)auVar32)->direction;
                                      fVar79 = (fVar78 - fVar75) * fVar73;
                                      lVar53 = (long)(int)fVar76;
                                      pfVar31[lVar53] =
                                           (((fVar76 - (float)(int)fVar76) + 1.0) * -0.5 + 1.0) *
                                           fVar79 + pfVar31[lVar53];
                                      if (iVar40 - iVar45 != 0 && iVar45 <= iVar40) {
                                        do {
                                          pfVar31[lVar53 + 1] =
                                               fVar77 * fVar73 * 0.5 + fVar79 + pfVar31[lVar53 + 1];
                                          fVar79 = fVar79 + fVar77 * fVar73;
                                          lVar53 = lVar53 + 1;
                                        } while (iVar40 + -1 != (int)lVar53);
                                      }
                                      if (1.01 < ABS(fVar79)) {
                                        __assert_fail("fabs(area) <= 1.01f",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/stb_truetype.h"
                                                  ,0x7d3,
                                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                                  );
                                      }
                                      uVar28 = (ulong)iVar40;
                                      pfVar31[uVar28] =
                                           (fVar70 - (fVar77 * (float)(iVar40 - iVar45) + fVar78)) *
                                           (((fVar74 - (float)iVar40) + 0.0) * -0.5 + 1.0) * fVar73
                                           + fVar79 + pfVar31[uVar28];
                                      fVar73 = (fVar70 - fVar75) * fVar73;
                                    }
                                    local_2c0[uVar28] = fVar73 + local_2c0[uVar28];
                                  }
                                }
                                else if (fVar73 < fVar71) {
                                  if (0.0 <= fVar73) {
                                    stbtt__handle_clipped_edge
                                              (pfVar31,(int)fVar73,(stbtt__active_edge *)auVar32,
                                               fVar73,fVar69,fVar73,fVar72);
                                    iVar45 = (int)fVar73 + 1;
                                  }
                                  else {
                                    iVar45 = 0;
                                  }
                                  stbtt__handle_clipped_edge
                                            (scanline,iVar45,(stbtt__active_edge *)auVar32,fVar73,
                                             fVar69,fVar73,fVar72);
                                }
                              }
                              auVar32 = local_3d0;
                              if ((uint)local_3a8._0_4_ < 0x7fffffff) {
                                fVar69 = 0.0;
                                pfVar35 = pfVar31;
                                pvVar61 = local_3b0;
                                lVar53 = local_260;
                                do {
                                  fVar69 = fVar69 + pfVar35[local_260];
                                  iVar45 = (int)(ABS(*pfVar35 + fVar69) * 255.0 + 0.5);
                                  uVar51 = (uchar)iVar45;
                                  if (0xfe < iVar45) {
                                    uVar51 = 0xff;
                                  }
                                  local_2c8[(int)pvVar61] = uVar51;
                                  pvVar61 = (void *)(ulong)((int)pvVar61 + 1);
                                  pfVar35 = pfVar35 + 1;
                                  lVar53 = lVar53 + -1;
                                } while (lVar53 != 0);
                              }
                              for (; auVar32 != (undefined1  [8])0x0;
                                  auVar32 = (undefined1  [8])((stbtt__active_edge *)auVar32)->next)
                              {
                                ((stbtt__active_edge *)auVar32)->fx =
                                     ((stbtt__active_edge *)auVar32)->fdx +
                                     ((stbtt__active_edge *)auVar32)->fx;
                              }
                              iVar45 = (int)local_390 + 1;
                              uVar28 = (ulong)((uint)local_248 + 1);
                              local_3b0 = (void *)(ulong)((int)local_3b0 + local_374);
                            } while ((uint)local_248 != uVar41);
                          }
                          else {
                            local_418 = (undefined8 *)0x0;
                          }
                          while (local_418 != (undefined8 *)0x0) {
                            puVar33 = (undefined8 *)*local_418;
                            ImGui::MemFree(local_418);
                            local_418 = puVar33;
                          }
                          if (pfVar31 != (float *)&local_238) {
                            ImGui::MemFree(pfVar31);
                          }
                          ImGui::MemFree(p_00);
                        }
                        ImGui::MemFree(pvVar30);
                        ImGui::MemFree(local_300);
                      }
                    }
                  }
                  ImGui::MemFree((void *)CONCAT44(local_330._4_4_,(int)local_330));
                  uVar26 = local_370.h_oversample;
                  uVar28 = local_370._32_8_ & 0xffffffff;
                  if (1 < uVar28) {
                    lVar53 = (long)local_370.stride_in_bytes;
                    uVar16 = *(ushort *)(local_308 + 4);
                    uVar38 = *(ushort *)(local_308 + 6);
                    local_238 = 0;
                    if (uVar38 != 0) {
                      puVar29 = local_370.pixels +
                                (ulong)*(ushort *)(local_308 + 10) * lVar53 +
                                (ulong)*(ushort *)(local_308 + 8);
                      iVar45 = uVar16 - local_370.h_oversample;
                      uVar58 = (ulong)(iVar45 + 1);
                      uVar39 = 0;
                      do {
                        memset(&local_238,0,uVar28);
                        switch(uVar26) {
                        case 2:
                          if (iVar45 < 0) {
LAB_00144a07:
                            uVar42 = 0;
                            uVar52 = 0;
                          }
                          else {
                            uVar42 = 0;
                            uVar52 = 0;
                            do {
                              bVar1 = puVar29[uVar42];
                              bVar3 = *(byte *)((long)&local_238 + (ulong)((uint)uVar42 & 7));
                              *(byte *)((long)&local_238 + (ulong)((uint)uVar42 + 2 & 7)) = bVar1;
                              uVar52 = uVar52 + ((uint)bVar1 - (uint)bVar3);
                              puVar29[uVar42] = (uchar)(uVar52 >> 1);
                              uVar42 = uVar42 + 1;
                            } while (uVar58 != uVar42);
                          }
                          break;
                        case 3:
                          if (iVar45 < 0) goto LAB_00144a07;
                          uVar42 = 0;
                          uVar52 = 0;
                          do {
                            bVar1 = puVar29[uVar42];
                            bVar3 = *(byte *)((long)&local_238 + (ulong)((uint)uVar42 & 7));
                            *(byte *)((long)&local_238 + (ulong)((uint)uVar42 + 3 & 7)) = bVar1;
                            uVar52 = uVar52 + ((uint)bVar1 - (uint)bVar3);
                            puVar29[uVar42] = (uchar)(uVar52 / 3);
                            uVar42 = uVar42 + 1;
                          } while (uVar58 != uVar42);
                          break;
                        case 4:
                          if (iVar45 < 0) goto LAB_00144a07;
                          uVar42 = 0;
                          uVar52 = 0;
                          do {
                            bVar1 = puVar29[uVar42];
                            uVar48 = (ulong)((uint)uVar42 & 7);
                            *(byte *)((long)&local_238 + (uVar48 ^ 4)) = bVar1;
                            uVar52 = uVar52 + ((uint)bVar1 -
                                              (uint)*(byte *)((long)&local_238 + uVar48));
                            puVar29[uVar42] = (uchar)(uVar52 >> 2);
                            uVar42 = uVar42 + 1;
                          } while (uVar58 != uVar42);
                          break;
                        case 5:
                          if (iVar45 < 0) goto LAB_00144a07;
                          uVar42 = 0;
                          uVar52 = 0;
                          do {
                            bVar1 = puVar29[uVar42];
                            bVar3 = *(byte *)((long)&local_238 + (ulong)((uint)uVar42 & 7));
                            *(byte *)((long)&local_238 + (ulong)((uint)uVar42 + 5 & 7)) = bVar1;
                            uVar52 = uVar52 + ((uint)bVar1 - (uint)bVar3);
                            puVar29[uVar42] = (uchar)(uVar52 / 5);
                            uVar42 = uVar42 + 1;
                          } while (uVar58 != uVar42);
                          break;
                        default:
                          if (iVar45 < 0) goto LAB_00144a07;
                          uVar42 = 0;
                          uVar52 = 0;
                          do {
                            bVar1 = puVar29[uVar42];
                            bVar3 = *(byte *)((long)&local_238 + (ulong)((uint)uVar42 & 7));
                            *(byte *)((long)&local_238 + (ulong)(uVar26 + (uint)uVar42 & 7)) = bVar1
                            ;
                            uVar52 = uVar52 + ((uint)bVar1 - (uint)bVar3);
                            puVar29[uVar42] = (uchar)(uVar52 / uVar26);
                            uVar42 = uVar42 + 1;
                          } while (uVar58 != uVar42);
                        }
                        if ((int)uVar42 < (int)(uint)uVar16) {
                          uVar42 = uVar42 & 0xffffffff;
                          do {
                            if (puVar29[uVar42] != '\0') {
                              __assert_fail("pixels[i] == 0",
                                            "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/stb_truetype.h"
                                            ,0xada,
                                            "void stbtt__h_prefilter(unsigned char *, int, int, int, unsigned int)"
                                           );
                            }
                            uVar52 = uVar52 - *(byte *)((long)&local_238 + (ulong)((uint)uVar42 & 7)
                                                       );
                            puVar29[uVar42] = (uchar)(uVar52 / uVar26);
                            uVar42 = uVar42 + 1;
                          } while ((int)uVar42 < (int)(uint)uVar16);
                        }
                        puVar29 = puVar29 + lVar53;
                        uVar39 = uVar39 + 1;
                      } while (uVar39 != uVar38);
                    }
                  }
                  uVar26 = local_370.v_oversample;
                  uVar28 = (ulong)local_370.v_oversample;
                  if (1 < uVar28) {
                    lVar53 = (long)local_370.stride_in_bytes;
                    uVar16 = *(ushort *)(local_308 + 4);
                    uVar39 = (uint)*(ushort *)(local_308 + 6);
                    local_238 = 0;
                    if (uVar16 != 0) {
                      pbVar66 = local_370.pixels +
                                (ulong)*(ushort *)(local_308 + 10) * lVar53 +
                                (ulong)*(ushort *)(local_308 + 8);
                      iVar45 = uVar39 - local_370.v_oversample;
                      uVar58 = (ulong)(iVar45 + 1);
                      uVar52 = 0;
                      do {
                        memset(&local_238,0,uVar28);
                        switch(uVar26) {
                        case 2:
                          if (iVar45 < 0) {
LAB_00144c7d:
                            uVar42 = 0;
                            uVar41 = 0;
                          }
                          else {
                            uVar42 = 0;
                            uVar41 = 0;
                            pbVar55 = pbVar66;
                            do {
                              bVar1 = *pbVar55;
                              bVar3 = *(byte *)((long)&local_238 + (ulong)((uint)uVar42 & 7));
                              *(byte *)((long)&local_238 + (ulong)((uint)uVar42 + 2 & 7)) = bVar1;
                              uVar41 = uVar41 + ((uint)bVar1 - (uint)bVar3);
                              *pbVar55 = (byte)(uVar41 >> 1);
                              uVar42 = uVar42 + 1;
                              pbVar55 = pbVar55 + lVar53;
                            } while (uVar58 != uVar42);
                          }
                          break;
                        case 3:
                          if (iVar45 < 0) goto LAB_00144c7d;
                          uVar42 = 0;
                          uVar41 = 0;
                          pbVar55 = pbVar66;
                          do {
                            bVar1 = *pbVar55;
                            bVar3 = *(byte *)((long)&local_238 + (ulong)((uint)uVar42 & 7));
                            *(byte *)((long)&local_238 + (ulong)((uint)uVar42 + 3 & 7)) = bVar1;
                            uVar41 = uVar41 + ((uint)bVar1 - (uint)bVar3);
                            *pbVar55 = (byte)(uVar41 / 3);
                            uVar42 = uVar42 + 1;
                            pbVar55 = pbVar55 + lVar53;
                          } while (uVar58 != uVar42);
                          break;
                        case 4:
                          if (iVar45 < 0) goto LAB_00144c7d;
                          uVar42 = 0;
                          uVar41 = 0;
                          pbVar55 = pbVar66;
                          do {
                            bVar1 = *pbVar55;
                            uVar48 = (ulong)((uint)uVar42 & 7);
                            *(byte *)((long)&local_238 + (uVar48 ^ 4)) = bVar1;
                            uVar41 = uVar41 + ((uint)bVar1 -
                                              (uint)*(byte *)((long)&local_238 + uVar48));
                            *pbVar55 = (byte)(uVar41 >> 2);
                            uVar42 = uVar42 + 1;
                            pbVar55 = pbVar55 + lVar53;
                          } while (uVar58 != uVar42);
                          break;
                        case 5:
                          if (iVar45 < 0) goto LAB_00144c7d;
                          uVar42 = 0;
                          uVar41 = 0;
                          pbVar55 = pbVar66;
                          do {
                            bVar1 = *pbVar55;
                            bVar3 = *(byte *)((long)&local_238 + (ulong)((uint)uVar42 & 7));
                            *(byte *)((long)&local_238 + (ulong)((uint)uVar42 + 5 & 7)) = bVar1;
                            uVar41 = uVar41 + ((uint)bVar1 - (uint)bVar3);
                            *pbVar55 = (byte)(uVar41 / 5);
                            uVar42 = uVar42 + 1;
                            pbVar55 = pbVar55 + lVar53;
                          } while (uVar58 != uVar42);
                          break;
                        default:
                          if (iVar45 < 0) goto LAB_00144c7d;
                          uVar42 = 0;
                          uVar41 = 0;
                          pbVar55 = pbVar66;
                          do {
                            bVar1 = *pbVar55;
                            bVar3 = *(byte *)((long)&local_238 + (ulong)((uint)uVar42 & 7));
                            *(byte *)((long)&local_238 + (ulong)(uVar26 + (uint)uVar42 & 7)) = bVar1
                            ;
                            uVar41 = uVar41 + ((uint)bVar1 - (uint)bVar3);
                            *pbVar55 = (byte)(uVar41 / uVar26);
                            uVar42 = uVar42 + 1;
                            pbVar55 = pbVar55 + lVar53;
                          } while (uVar58 != uVar42);
                        }
                        iVar40 = (int)uVar42;
                        iVar56 = uVar39 - iVar40;
                        if (iVar56 != 0 && iVar40 <= (int)uVar39) {
                          lVar46 = (long)iVar40;
                          pbVar55 = pbVar66 + lVar53 * lVar46;
                          do {
                            if (*pbVar55 != 0) {
                              __assert_fail("pixels[i*stride_in_bytes] == 0",
                                            "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/stb_truetype.h"
                                            ,0xb18,
                                            "void stbtt__v_prefilter(unsigned char *, int, int, int, unsigned int)"
                                           );
                            }
                            uVar41 = uVar41 - *(byte *)((long)&local_238 + (ulong)((uint)lVar46 & 7)
                                                       );
                            *pbVar55 = (byte)(uVar41 / uVar26);
                            lVar46 = lVar46 + 1;
                            pbVar55 = pbVar55 + lVar53;
                            iVar56 = iVar56 + -1;
                          } while (iVar56 != 0);
                        }
                        pbVar66 = pbVar66 + 1;
                        uVar52 = uVar52 + 1;
                      } while (uVar52 != uVar16);
                    }
                  }
                  sVar17 = (short)*(undefined4 *)(local_308 + 8);
                  *local_278 = sVar17;
                  sVar4 = *(short *)(local_308 + 10);
                  local_278[1] = sVar4;
                  uVar16 = *(ushort *)(local_308 + 4);
                  local_278[2] = sVar17 + uVar16;
                  uVar38 = *(ushort *)(local_308 + 6);
                  local_278[3] = sVar4 + uVar38;
                  *(float *)(local_278 + 8) =
                       (float)(int)(short)((short)(local_2e0 << 8) + (short)local_2e4) * local_2b8;
                  *(float *)(local_278 + 4) = (float)local_2d8 * local_2e8 + local_37c;
                  *(float *)(local_278 + 6) = (float)local_2dc * local_2ec + local_378;
                  *(float *)(local_278 + 10) =
                       (float)(int)(local_2d8 + (uint)uVar16) * local_2e8 + local_37c;
                  *(float *)(local_278 + 0xc) =
                       (float)(int)(local_2dc + (uint)uVar38) * local_2ec + local_378;
                  lVar44 = local_270;
                  lVar47 = local_280;
                  lVar53 = local_288;
                  lVar46 = local_268;
                  fVar68 = local_37c;
                }
                lVar46 = lVar46 + 1;
                lVar44 = lVar44 + 1;
              } while (lVar44 < *(int *)(lVar47 + 0x10));
            }
            lVar44 = local_290 + 1;
          } while (lVar44 != local_298);
        }
        local_370.v_oversample = local_2f4;
        local_370.h_oversample = local_2f0;
        local_388[1].userdata = (void *)0x0;
        lVar53 = local_2a0 + 1;
      } while (lVar53 < (this->ConfigData).Size);
    }
    ImGui::MemFree(local_370.nodes);
    ImGui::MemFree(local_370.pack_info);
    ImGui::MemFree(local_310);
    if (0 < (this->ConfigData).Size) {
      lVar53 = 0;
      do {
        pIVar60 = (this->ConfigData).Data;
        pIVar6 = pIVar60 + lVar53;
        lVar47 = lVar53 * 0x50;
        pIVar7 = pIVar60[lVar53].DstFont;
        fVar68 = pIVar60[lVar53].SizePixels;
        lVar46 = *(long *)((long)local_3b8 + lVar47 + 8);
        lVar44 = (long)*(int *)((long)local_3b8 + lVar47 + 0x24);
        uVar39 = (int)(short)((ushort)*(byte *)(lVar46 + 4 + lVar44) << 8) |
                 (uint)*(byte *)(lVar46 + 5 + lVar44);
        uVar26 = (int)(short)((ushort)*(byte *)(lVar46 + 6 + lVar44) << 8) |
                 (uint)*(byte *)(lVar46 + 7 + lVar44);
        fVar71 = fVar68 / (float)(int)(uVar39 - uVar26);
        fVar69 = (float)(int)uVar39 * fVar71;
        if (pIVar60[lVar53].MergeMode == false) {
          pIVar7->ContainerAtlas = this;
          pIVar7->ConfigData = pIVar6;
          pIVar7->ConfigDataCount = 0;
          pIVar7->FontSize = fVar68;
          pIVar7->Ascent = fVar69;
          pIVar7->Descent = fVar71 * (float)(int)(short)uVar26;
          iVar45 = (pIVar7->Glyphs).Capacity;
          if (iVar45 < 0) {
            uVar26 = iVar45 / 2 + iVar45;
            if ((int)uVar26 < 1) {
              uVar26 = 0;
            }
            pGVar36 = (Glyph *)ImGui::MemAlloc((ulong)uVar26 * 0x28);
            pGVar37 = (pIVar7->Glyphs).Data;
            if (pGVar37 != (Glyph *)0x0) {
              memcpy(pGVar36,pGVar37,(long)(pIVar7->Glyphs).Size * 0x28);
            }
            ImGui::MemFree((pIVar7->Glyphs).Data);
            (pIVar7->Glyphs).Data = pGVar36;
            (pIVar7->Glyphs).Capacity = uVar26;
          }
          (pIVar7->Glyphs).Size = 0;
        }
        pIVar7->ConfigDataCount = pIVar7->ConfigDataCount + 1;
        fVar68 = 0.0;
        if ((pIVar6->MergeMode == true) && (pIVar6->MergeGlyphCenterV == true)) {
          fVar68 = (fVar69 - pIVar7->Ascent) * 0.5;
        }
        pIVar7->FallbackGlyph = (Glyph *)0x0;
        local_390 = lVar53;
        if (0 < *(int *)(lVar47 + (long)local_3b8 + 0x48)) {
          lVar53 = 0;
          local_3a8 = (void *)CONCAT44(local_3a8._4_4_,fVar68);
          local_3b0 = (void *)(lVar47 + (long)local_3b8);
          do {
            if (0 < *(int *)(*(long *)((long)local_3b0 + 0x40) + 0x10 + lVar53 * 0x28)) {
              lVar46 = *(long *)((long)local_3b0 + 0x40) + lVar53 * 0x28;
              lVar44 = 0;
              lVar47 = 0;
              do {
                lVar11 = *(long *)(lVar46 + 0x18);
                if ((((*(short *)(lVar11 + lVar44) != 0) || (*(short *)(lVar11 + 4 + lVar44) != 0))
                    || (*(short *)(lVar11 + 2 + lVar44) != 0)) ||
                   (*(short *)(lVar11 + 6 + lVar44) != 0)) {
                  uVar26 = *(uint *)(lVar46 + 4);
                  if (pIVar6->MergeMode == true) {
                    uVar28 = lVar47 + (ulong)uVar26;
                    if (((int)((uint)uVar28 & 0xffff) < (pIVar7->IndexLookup).Size) &&
                       (uVar16 = (pIVar7->IndexLookup).Data[uVar28 & 0xffff], uVar16 != 0xffff)) {
                      pGVar37 = (Glyph *)((long)&((pIVar7->Glyphs).Data)->Codepoint +
                                         (ulong)((uint)uVar16 * 0x28));
                    }
                    else {
                      pGVar37 = pIVar7->FallbackGlyph;
                    }
                    if (pGVar37 != (Glyph *)0x0) goto LAB_00145398;
                  }
                  fVar72 = *(float *)(lVar11 + 8 + lVar44) + 0.0;
                  fVar70 = *(float *)(lVar11 + 0xc + lVar44) + 0.0;
                  fVar71 = *(float *)(lVar11 + 0x14 + lVar44);
                  iVar45 = this->TexHeight;
                  fVar73 = *(float *)(lVar11 + 0x18 + lVar44) + 0.0;
                  fVar69 = (float)this->TexWidth;
                  uVar16 = *(ushort *)(lVar11 + lVar44);
                  uVar38 = *(ushort *)(lVar11 + 2 + lVar44);
                  uVar49 = *(ushort *)(lVar11 + 4 + lVar44);
                  uVar5 = *(ushort *)(lVar11 + 6 + lVar44);
                  iVar40 = (pIVar7->Glyphs).Size;
                  iVar56 = (pIVar7->Glyphs).Capacity;
                  uVar39 = iVar40 + 1;
                  if (iVar56 <= iVar40) {
                    if (iVar56 == 0) {
                      uVar52 = 8;
                    }
                    else {
                      uVar52 = iVar56 / 2 + iVar56;
                    }
                    if ((int)uVar52 <= (int)uVar39) {
                      uVar52 = uVar39;
                    }
                    if (iVar56 < (int)uVar52) {
                      local_3a0 = CONCAT44(local_3a0._4_4_,fVar69);
                      local_3c8._0_4_ = fVar72;
                      pGVar36 = (Glyph *)ImGui::MemAlloc((long)(int)uVar52 * 0x28);
                      pGVar37 = (pIVar7->Glyphs).Data;
                      if (pGVar37 != (Glyph *)0x0) {
                        memcpy(pGVar36,pGVar37,(long)(pIVar7->Glyphs).Size * 0x28);
                      }
                      ImGui::MemFree((pIVar7->Glyphs).Data);
                      (pIVar7->Glyphs).Data = pGVar36;
                      (pIVar7->Glyphs).Capacity = uVar52;
                      fVar69 = (float)local_3a0;
                      fVar68 = local_3a8._0_4_;
                      fVar72 = (float)local_3c8._0_4_;
                    }
                  }
                  (pIVar7->Glyphs).Size = uVar39;
                  if (iVar40 < 0) {
                    __assert_fail("Size > 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.h"
                                  ,0x365,
                                  "value_type &ImVector<ImFont::Glyph>::back() [T = ImFont::Glyph]")
                    ;
                  }
                  fVar77 = 1.0 / (float)iVar45;
                  pGVar37 = (pIVar7->Glyphs).Data;
                  pGVar37[(ulong)uVar39 - 1].Codepoint = (short)uVar26 + (short)lVar47;
                  pGVar37[(ulong)uVar39 - 1].X0 = fVar72;
                  pGVar37[(ulong)uVar39 - 1].Y0 = fVar70;
                  pGVar37[(ulong)uVar39 - 1].X1 = fVar71 + 0.0;
                  pGVar37[(ulong)uVar39 - 1].Y1 = fVar73;
                  pGVar37[(ulong)uVar39 - 1].U0 = (float)uVar16 * (1.0 / fVar69);
                  pGVar37[(ulong)uVar39 - 1].V0 = (float)uVar38 * fVar77;
                  pGVar37[(ulong)uVar39 - 1].U1 = (float)uVar49 * (1.0 / fVar69);
                  pGVar37[(ulong)uVar39 - 1].V1 = (float)uVar5 * fVar77;
                  fVar71 = (float)(int)(pIVar7->Ascent + fVar68 + 0.5);
                  pGVar37[(ulong)uVar39 - 1].Y0 = fVar70 + fVar71;
                  pGVar37[(ulong)uVar39 - 1].Y1 = fVar73 + fVar71;
                  fVar71 = *(float *)(lVar11 + 0x10 + lVar44) + (pIVar6->GlyphExtraSpacing).x;
                  pGVar37[(ulong)uVar39 - 1].XAdvance = fVar71;
                  if (pIVar6->PixelSnapH == true) {
                    pGVar37[(ulong)uVar39 - 1].XAdvance = (float)(int)(fVar71 + 0.5);
                  }
                }
LAB_00145398:
                lVar47 = lVar47 + 1;
                lVar44 = lVar44 + 0x1c;
              } while (lVar47 < *(int *)(lVar46 + 0x10));
            }
            lVar53 = lVar53 + 1;
          } while (lVar53 < *(int *)((long)local_3b0 + 0x48));
        }
        ImFont::BuildLookupTable(pIVar6->DstFont);
        lVar53 = local_390 + 1;
      } while (lVar53 < (this->ConfigData).Size);
    }
    ImGui::MemFree(local_338);
    ImGui::MemFree(local_318);
    ImGui::MemFree(local_3b8);
    RenderCustomTexData(this,1,&local_328);
    ImVector<stbrp_rect>::~ImVector(&local_328);
  }
  return bVar67;
}

Assistant:

bool    ImFontAtlas::Build()
{
    IM_ASSERT(ConfigData.Size > 0);

    TexID = NULL;
    TexWidth = TexHeight = 0;
    TexUvWhitePixel = ImVec2(0, 0);
    ClearTexData();

    struct ImFontTempBuildData
    {
        stbtt_fontinfo      FontInfo;
        stbrp_rect*         Rects;
        stbtt_pack_range*   Ranges;
        int                 RangesCount;
    };
    ImFontTempBuildData* tmp_array = (ImFontTempBuildData*)ImGui::MemAlloc((size_t)ConfigData.Size * sizeof(ImFontTempBuildData));

    // Initialize font information early (so we can error without any cleanup) + count glyphs
    int total_glyph_count = 0;
    int total_glyph_range_count = 0;
    for (int input_i = 0; input_i < ConfigData.Size; input_i++)
    {
        ImFontConfig& cfg = ConfigData[input_i];
        ImFontTempBuildData& tmp = tmp_array[input_i];

        IM_ASSERT(cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == this));
        const int font_offset = stbtt_GetFontOffsetForIndex((unsigned char*)cfg.FontData, cfg.FontNo);
        IM_ASSERT(font_offset >= 0);
        if (!stbtt_InitFont(&tmp.FontInfo, (unsigned char*)cfg.FontData, font_offset))
            return false;

        // Count glyphs
        if (!cfg.GlyphRanges)
            cfg.GlyphRanges = GetGlyphRangesDefault();
        for (const ImWchar* in_range = cfg.GlyphRanges; in_range[0] && in_range[1]; in_range += 2)
        {
            total_glyph_count += (in_range[1] - in_range[0]) + 1;
            total_glyph_range_count++;
        }
    }

    // Start packing. We need a known width for the skyline algorithm. Using a cheap heuristic here to decide of width. User can override TexDesiredWidth if they wish.
    // After packing is done, width shouldn't matter much, but some API/GPU have texture size limitations and increasing width can decrease height.
    TexWidth = (TexDesiredWidth > 0) ? TexDesiredWidth : (total_glyph_count > 4000) ? 4096 : (total_glyph_count > 2000) ? 2048 : (total_glyph_count > 1000) ? 1024 : 512;
    TexHeight = 0;
    const int max_tex_height = 1024*32;
    stbtt_pack_context spc;
    stbtt_PackBegin(&spc, NULL, TexWidth, max_tex_height, 0, 1, NULL);

    // Pack our extra data rectangles first, so it will be on the upper-left corner of our texture (UV will have small values).
    ImVector<stbrp_rect> extra_rects;
    RenderCustomTexData(0, &extra_rects);
    stbtt_PackSetOversampling(&spc, 1, 1);
    stbrp_pack_rects((stbrp_context*)spc.pack_info, &extra_rects[0], extra_rects.Size);
    for (int i = 0; i < extra_rects.Size; i++)
        if (extra_rects[i].was_packed)
            TexHeight = ImMax(TexHeight, extra_rects[i].y + extra_rects[i].h);

    // Allocate packing character data and flag packed characters buffer as non-packed (x0=y0=x1=y1=0)
    int buf_packedchars_n = 0, buf_rects_n = 0, buf_ranges_n = 0;
    stbtt_packedchar* buf_packedchars = (stbtt_packedchar*)ImGui::MemAlloc(total_glyph_count * sizeof(stbtt_packedchar));
    stbrp_rect* buf_rects = (stbrp_rect*)ImGui::MemAlloc(total_glyph_count * sizeof(stbrp_rect));
    stbtt_pack_range* buf_ranges = (stbtt_pack_range*)ImGui::MemAlloc(total_glyph_range_count * sizeof(stbtt_pack_range));
    memset(buf_packedchars, 0, total_glyph_count * sizeof(stbtt_packedchar));
    memset(buf_rects, 0, total_glyph_count * sizeof(stbrp_rect));              // Unnecessary but let's clear this for the sake of sanity.
    memset(buf_ranges, 0, total_glyph_range_count * sizeof(stbtt_pack_range));

    // First font pass: pack all glyphs (no rendering at this point, we are working with rectangles in an infinitely tall texture at this point)
    for (int input_i = 0; input_i < ConfigData.Size; input_i++)
    {
        ImFontConfig& cfg = ConfigData[input_i];
        ImFontTempBuildData& tmp = tmp_array[input_i];

        // Setup ranges
        int glyph_count = 0;
        int glyph_ranges_count = 0;
        for (const ImWchar* in_range = cfg.GlyphRanges; in_range[0] && in_range[1]; in_range += 2)
        {
            glyph_count += (in_range[1] - in_range[0]) + 1;
            glyph_ranges_count++;
        }
        tmp.Ranges = buf_ranges + buf_ranges_n;
        tmp.RangesCount = glyph_ranges_count;
        buf_ranges_n += glyph_ranges_count;
        for (int i = 0; i < glyph_ranges_count; i++)
        {
            const ImWchar* in_range = &cfg.GlyphRanges[i * 2];
            stbtt_pack_range& range = tmp.Ranges[i];
            range.font_size = cfg.SizePixels;
            range.first_unicode_codepoint_in_range = in_range[0];
            range.num_chars = (in_range[1] - in_range[0]) + 1;
            range.chardata_for_range = buf_packedchars + buf_packedchars_n;
            buf_packedchars_n += range.num_chars;
        }

        // Pack
        tmp.Rects = buf_rects + buf_rects_n;
        buf_rects_n += glyph_count;
        stbtt_PackSetOversampling(&spc, cfg.OversampleH, cfg.OversampleV);
        int n = stbtt_PackFontRangesGatherRects(&spc, &tmp.FontInfo, tmp.Ranges, tmp.RangesCount, tmp.Rects);
        stbrp_pack_rects((stbrp_context*)spc.pack_info, tmp.Rects, n);

        // Extend texture height
        for (int i = 0; i < n; i++)
            if (tmp.Rects[i].was_packed)
                TexHeight = ImMax(TexHeight, tmp.Rects[i].y + tmp.Rects[i].h);
    }
    IM_ASSERT(buf_rects_n == total_glyph_count);
    IM_ASSERT(buf_packedchars_n == total_glyph_count);
    IM_ASSERT(buf_ranges_n == total_glyph_range_count);

    // Create texture
    TexHeight = ImUpperPowerOfTwo(TexHeight);
    TexPixelsAlpha8 = (unsigned char*)ImGui::MemAlloc(TexWidth * TexHeight);
    memset(TexPixelsAlpha8, 0, TexWidth * TexHeight);
    spc.pixels = TexPixelsAlpha8;
    spc.height = TexHeight;

    // Second pass: render characters
    for (int input_i = 0; input_i < ConfigData.Size; input_i++)
    {
        ImFontConfig& cfg = ConfigData[input_i];
        ImFontTempBuildData& tmp = tmp_array[input_i];
        stbtt_PackSetOversampling(&spc, cfg.OversampleH, cfg.OversampleV);
        stbtt_PackFontRangesRenderIntoRects(&spc, &tmp.FontInfo, tmp.Ranges, tmp.RangesCount, tmp.Rects);
        tmp.Rects = NULL;
    }

    // End packing
    stbtt_PackEnd(&spc);
    ImGui::MemFree(buf_rects);
    buf_rects = NULL;

    // Third pass: setup ImFont and glyphs for runtime
    for (int input_i = 0; input_i < ConfigData.Size; input_i++)
    {
        ImFontConfig& cfg = ConfigData[input_i];
        ImFontTempBuildData& tmp = tmp_array[input_i];
        ImFont* dst_font = cfg.DstFont;

        float font_scale = stbtt_ScaleForPixelHeight(&tmp.FontInfo, cfg.SizePixels);
        int unscaled_ascent, unscaled_descent, unscaled_line_gap;
        stbtt_GetFontVMetrics(&tmp.FontInfo, &unscaled_ascent, &unscaled_descent, &unscaled_line_gap);

        float ascent = unscaled_ascent * font_scale;
        float descent = unscaled_descent * font_scale;
        if (!cfg.MergeMode)
        {
            dst_font->ContainerAtlas = this;
            dst_font->ConfigData = &cfg;
            dst_font->ConfigDataCount = 0;
            dst_font->FontSize = cfg.SizePixels;
            dst_font->Ascent = ascent;
            dst_font->Descent = descent;
            dst_font->Glyphs.resize(0);
        }
        dst_font->ConfigDataCount++;
        float off_y = (cfg.MergeMode && cfg.MergeGlyphCenterV) ? (ascent - dst_font->Ascent) * 0.5f : 0.0f;

        dst_font->FallbackGlyph = NULL; // Always clear fallback so FindGlyph can return NULL. It will be set again in BuildLookupTable()
        for (int i = 0; i < tmp.RangesCount; i++)
        {
            stbtt_pack_range& range = tmp.Ranges[i];
            for (int char_idx = 0; char_idx < range.num_chars; char_idx += 1)
            {
                const stbtt_packedchar& pc = range.chardata_for_range[char_idx];
                if (!pc.x0 && !pc.x1 && !pc.y0 && !pc.y1)
                    continue;

                const int codepoint = range.first_unicode_codepoint_in_range + char_idx;
                if (cfg.MergeMode && dst_font->FindGlyph((unsigned short)codepoint))
                    continue;

                stbtt_aligned_quad q;
                float dummy_x = 0.0f, dummy_y = 0.0f;
                stbtt_GetPackedQuad(range.chardata_for_range, TexWidth, TexHeight, char_idx, &dummy_x, &dummy_y, &q, 0);

                dst_font->Glyphs.resize(dst_font->Glyphs.Size + 1);
                ImFont::Glyph& glyph = dst_font->Glyphs.back();
                glyph.Codepoint = (ImWchar)codepoint;
                glyph.X0 = q.x0; glyph.Y0 = q.y0; glyph.X1 = q.x1; glyph.Y1 = q.y1;
                glyph.U0 = q.s0; glyph.V0 = q.t0; glyph.U1 = q.s1; glyph.V1 = q.t1;
                glyph.Y0 += (float)(int)(dst_font->Ascent + off_y + 0.5f);
                glyph.Y1 += (float)(int)(dst_font->Ascent + off_y + 0.5f);
                glyph.XAdvance = (pc.xadvance + cfg.GlyphExtraSpacing.x);  // Bake spacing into XAdvance
                if (cfg.PixelSnapH)
                    glyph.XAdvance = (float)(int)(glyph.XAdvance + 0.5f);
            }
        }
        cfg.DstFont->BuildLookupTable();
    }

    // Cleanup temporaries
    ImGui::MemFree(buf_packedchars);
    ImGui::MemFree(buf_ranges);
    ImGui::MemFree(tmp_array);

    // Render into our custom data block
    RenderCustomTexData(1, &extra_rects);

    return true;
}